

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printfcpp.cpp
# Opt level: O1

BOOL Internal_ExtractFormatA
               (CPalThread *pthrCurrent,LPCSTR *Fmt,LPSTR Out,LPINT Flags,LPINT Width,
               LPINT Precision,LPINT Prefix,LPINT Type)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  int *piVar7;
  byte *pbVar8;
  uint uVar9;
  char *pcVar10;
  BOOL BVar11;
  byte *pbVar12;
  
  *Width = -1;
  *Precision = -1;
  *Flags = 0;
  *Prefix = -1;
  *Type = -1;
  pcVar6 = *Fmt;
  if (pcVar6 == (char *)0x0) {
    return 0;
  }
  if (*pcVar6 != '%') {
    return 0;
  }
  *Fmt = pcVar6 + 1;
  *Out = *pcVar6;
  sVar5 = strlen(*Fmt);
  pcVar6 = (char *)CorUnix::InternalMalloc(sVar5 + 1);
  if (pcVar6 != (char *)0x0) {
    do {
      pbVar12 = (byte *)Out + 1;
      pbVar8 = (byte *)*Fmt;
      bVar1 = *pbVar8;
      uVar2 = *Flags;
      if (bVar1 < 0x2b) {
        if (bVar1 == 0x20) {
          uVar9 = 8;
        }
        else {
          if (bVar1 != 0x23) goto LAB_0011a31c;
          uVar9 = 2;
        }
      }
      else if (bVar1 == 0x30) {
        uVar9 = 4;
      }
      else {
        uVar9 = 1;
        if (bVar1 != 0x2d) {
          if (bVar1 != 0x2b) goto LAB_0011a31c;
          uVar9 = 0x10;
        }
      }
      *Flags = uVar2 | uVar9;
      *Fmt = (LPCSTR)(pbVar8 + 1);
      *pbVar12 = *pbVar8;
      Out = (LPSTR)pbVar12;
    } while( true );
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    piVar7 = __errno_location();
    *piVar7 = 8;
    return 0;
  }
  goto LAB_0011a794;
LAB_0011a31c:
  if ((~uVar2 & 5) == 0) {
    *Flags = uVar2 - 4;
  }
  iVar4 = isdigit((uint)*pbVar8);
  pbVar8 = (byte *)*Fmt;
  if (iVar4 != 0) {
    iVar4 = isdigit((uint)*pbVar8);
    pcVar10 = pcVar6;
    while (iVar4 != 0) {
      *pcVar10 = **Fmt;
      pcVar10 = pcVar10 + 1;
      pbVar8 = (byte *)*Fmt;
      *Fmt = (LPCSTR)(pbVar8 + 1);
      *pbVar12 = *pbVar8;
      pbVar12 = pbVar12 + 1;
      iVar4 = isdigit((uint)(byte)**Fmt);
    }
    *pcVar10 = '\0';
    iVar4 = atoi(pcVar6);
    *Width = iVar4;
    if (-1 < iVar4) goto LAB_0011a40a;
LAB_0011a48d:
    if (PAL_InitializeChakraCoreCalled != false) {
      piVar7 = __errno_location();
      *piVar7 = 0x54f;
      return 0;
    }
LAB_0011a794:
    abort();
  }
  if (*pbVar8 == 0x2a) {
    *Width = -2;
    *Fmt = (LPCSTR)(pbVar8 + 1);
    *pbVar12 = *pbVar8;
    pbVar12 = (byte *)Out + 2;
    iVar4 = isdigit((uint)(byte)**Fmt);
    if (iVar4 != 0) {
      *Width = -3;
      while (iVar4 = isdigit((uint)(byte)**Fmt), iVar4 != 0) {
        pbVar8 = (byte *)*Fmt;
        *Fmt = (LPCSTR)(pbVar8 + 1);
        *pbVar12 = *pbVar8;
        pbVar12 = pbVar12 + 1;
      }
    }
  }
LAB_0011a40a:
  pbVar3 = (byte *)*Fmt;
  pbVar8 = pbVar12;
  if (*pbVar3 == 0x2e) {
    *Fmt = (LPCSTR)(pbVar3 + 1);
    pbVar8 = pbVar12 + 1;
    *pbVar12 = *pbVar3;
    iVar4 = isdigit((uint)(byte)**Fmt);
    pbVar3 = (byte *)*Fmt;
    if (iVar4 == 0) {
      if (*pbVar3 == 0x2a) {
        *Precision = -2;
        *Fmt = (LPCSTR)(pbVar3 + 1);
        pbVar12[1] = *pbVar3;
        pbVar8 = pbVar12 + 2;
        iVar4 = isdigit((uint)(byte)**Fmt);
        if (iVar4 != 0) {
          *Precision = -4;
          while (iVar4 = isdigit((uint)(byte)**Fmt), iVar4 != 0) {
            pbVar12 = (byte *)*Fmt;
            *Fmt = (LPCSTR)(pbVar12 + 1);
            *pbVar8 = *pbVar12;
            pbVar8 = pbVar8 + 1;
          }
        }
      }
      else {
        *Precision = -3;
      }
    }
    else {
      iVar4 = isdigit((uint)*pbVar3);
      pcVar10 = pcVar6;
      while (iVar4 != 0) {
        *pcVar10 = **Fmt;
        pcVar10 = pcVar10 + 1;
        pbVar12 = (byte *)*Fmt;
        *Fmt = (LPCSTR)(pbVar12 + 1);
        *pbVar8 = *pbVar12;
        pbVar8 = pbVar8 + 1;
        iVar4 = isdigit((uint)(byte)**Fmt);
      }
      *pcVar10 = '\0';
      iVar4 = atoi(pcVar6);
      *Precision = iVar4;
      if (iVar4 < 0) goto LAB_0011a48d;
    }
  }
  pbVar12 = (byte *)*Fmt;
  if (*pbVar12 == 0x70) {
    *Prefix = 3;
  }
  bVar1 = *pbVar12;
  if (bVar1 < 0x68) {
    if (bVar1 != 0x49) {
      if (bVar1 != 0x4c) goto LAB_0011a581;
      goto LAB_0011a57b;
    }
    if (pbVar12[1] == 0x33) {
      if (pbVar12[2] == 0x32) {
        pbVar12 = pbVar12 + 3;
        goto LAB_0011a57e;
      }
LAB_0011a6fe:
      pbVar12 = pbVar12 + 1;
    }
    else {
      if ((pbVar12[1] != 0x36) || (pbVar12[2] != 0x34)) goto LAB_0011a6fe;
      pbVar12 = pbVar12 + 3;
    }
    *Fmt = (LPCSTR)pbVar12;
    *Prefix = 3;
  }
  else if (bVar1 == 0x68) {
    *Prefix = 1;
LAB_0011a57b:
    pbVar12 = pbVar12 + 1;
LAB_0011a57e:
    *Fmt = (LPCSTR)pbVar12;
  }
  else if ((bVar1 == 0x6c) || (bVar1 == 0x77)) {
    *Fmt = (LPCSTR)(pbVar12 + 1);
    if ((pbVar12[1] | 0x10) == 0x73) {
      *Prefix = 2;
    }
    if (pbVar12[1] == 0x6c) {
      *Prefix = 3;
      pbVar12 = pbVar12 + 2;
      goto LAB_0011a57e;
    }
  }
LAB_0011a581:
  pbVar12 = (byte *)*Fmt;
  bVar1 = *pbVar12;
  if (bVar1 < 0x58) {
    if (bVar1 != 0x43) {
      if (bVar1 != 0x45) {
        if (bVar1 == 0x53) goto switchD_0011a5a6_caseD_73;
        goto switchD_0011a5a6_caseD_68;
      }
      goto switchD_0011a5a6_caseD_65;
    }
switchD_0011a5a6_caseD_63:
    *Type = 1;
    if ((*Prefix != 1) && (*pbVar12 == 0x43)) {
      *Prefix = 2;
    }
    if (*Prefix == 2) {
      *pbVar8 = 0x6c;
      pbVar8 = pbVar8 + 1;
    }
    *pbVar8 = 99;
LAB_0011a66e:
    pbVar8 = pbVar8 + 1;
    *Fmt = *Fmt + 1;
  }
  else {
    switch(bVar1) {
    case 99:
      goto switchD_0011a5a6_caseD_63;
    case 100:
    case 0x69:
    case 0x6f:
    case 0x75:
    case 0x78:
      goto switchD_0011a5a6_caseD_64;
    case 0x65:
    case 0x66:
    case 0x67:
switchD_0011a5a6_caseD_65:
      *Type = 7;
      goto LAB_0011a6b7;
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x76:
    case 0x77:
switchD_0011a5a6_caseD_68:
      if (bVar1 != 0x70) {
        if (bVar1 != 0x6e) {
          BVar11 = 0;
          if (bVar1 != 0x47) goto LAB_0011a6cc;
          goto switchD_0011a5a6_caseD_65;
        }
        if (*Prefix == 1) {
          *pbVar8 = 0x68;
          pbVar8 = pbVar8 + 1;
        }
        pbVar12 = (byte *)*Fmt;
        *Fmt = (LPCSTR)(pbVar12 + 1);
        *pbVar8 = *pbVar12;
        pbVar8 = pbVar8 + 1;
        *Type = 6;
        goto LAB_0011a6c6;
      }
      *Type = 5;
      *Fmt = (LPCSTR)(pbVar12 + 1);
      if (*Prefix == 3) {
        if (*Precision == -1) {
          *Precision = 0x10;
          pbVar8[0] = 0x2e;
          pbVar8[1] = 0x31;
          pbVar8[2] = 0x36;
          pbVar8 = pbVar8 + 3;
        }
        pbVar8[0] = 0x6c;
        pbVar8[1] = 0x6c;
LAB_0011a787:
        pbVar8 = pbVar8 + 2;
      }
      else if (*Precision == -1) {
        *Precision = 8;
        pbVar8[0] = 0x2e;
        pbVar8[1] = 0x38;
        goto LAB_0011a787;
      }
      *pbVar8 = 0x58;
      goto LAB_0011a6c3;
    case 0x73:
switchD_0011a5a6_caseD_73:
      *Type = 2;
      if ((*Prefix != 1) && (*pbVar12 == 0x53)) {
        *Prefix = 2;
      }
      if (*Prefix == 2) {
        *pbVar8 = 0x6c;
        pbVar8 = pbVar8 + 1;
      }
      *pbVar8 = 0x73;
      goto LAB_0011a66e;
    }
    if (bVar1 != 0x58) goto switchD_0011a5a6_caseD_68;
switchD_0011a5a6_caseD_64:
    *Type = 4;
    iVar4 = *Prefix;
    if (iVar4 == 3) {
      pbVar8[0] = 0x6c;
      pbVar8[1] = 0x6c;
      pbVar8 = pbVar8 + 2;
    }
    else {
      if (iVar4 == 2) {
        *pbVar8 = 0x6c;
      }
      else {
        if (iVar4 != 1) goto LAB_0011a689;
        *pbVar8 = 0x68;
      }
      pbVar8 = pbVar8 + 1;
    }
LAB_0011a689:
    pbVar12 = (byte *)*Fmt;
LAB_0011a6b7:
    *Fmt = (LPCSTR)(pbVar12 + 1);
    *pbVar8 = *pbVar12;
LAB_0011a6c3:
    pbVar8 = pbVar8 + 1;
  }
LAB_0011a6c6:
  BVar11 = 1;
LAB_0011a6cc:
  *pbVar8 = 0;
  CorUnix::InternalFree(pcVar6);
  return BVar11;
}

Assistant:

BOOL Internal_ExtractFormatA(CPalThread *pthrCurrent, LPCSTR *Fmt, LPSTR Out, LPINT Flags,
    LPINT Width, LPINT Precision, LPINT Prefix, LPINT Type)
{
    BOOL Result = FALSE;
    LPSTR TempStr;
    LPSTR TempStrPtr;

    *Width = WIDTH_DEFAULT;
    *Precision = PRECISION_DEFAULT;
    *Flags = PFF_NONE;
    *Prefix = PFF_PREFIX_DEFAULT;
    *Type = PFF_TYPE_DEFAULT;

    if (*Fmt && **Fmt == '%')
    {
        *Out++ = *(*Fmt)++;
    }
    else
    {
        return Result;
    }

    /* we'll never need a temp string longer than the original */
    TempStrPtr = TempStr = (LPSTR) InternalMalloc(strlen(*Fmt)+1);
    if (!TempStr)
    {
        ERROR("InternalMalloc failed\n");
        pthrCurrent->SetLastError(ERROR_NOT_ENOUGH_MEMORY);
        return Result;
    }

    /* parse flags */
    while (**Fmt && (**Fmt == '-' || **Fmt == '+' ||
           **Fmt == '0' || **Fmt == ' ' || **Fmt == '#'))
    {
        switch (**Fmt)
        {
        case '-':
            *Flags |= PFF_MINUS; break;
        case '+':
            *Flags |= PFF_PLUS; break;
        case '0':
            *Flags |= PFF_ZERO; break;
        case ' ':
            *Flags |= PFF_SPACE; break;
        case '#':
            *Flags |= PFF_POUND; break;
        }
            *Out++ = *(*Fmt)++;
    }
    /* '-' flag negates '0' flag */
    if ((*Flags & PFF_MINUS) && (*Flags & PFF_ZERO))
    {
        *Flags -= PFF_ZERO;
    }

    /* grab width specifier */
    if (isdigit((unsigned char) **Fmt))
    {
        TempStrPtr = TempStr;
        while (isdigit((unsigned char) **Fmt))
        {
            *TempStrPtr++ = **Fmt;
            *Out++ = *(*Fmt)++;
        }
        *TempStrPtr = 0; /* end string */
        *Width = atoi(TempStr);
        if (*Width < 0)
        {
            ERROR("atoi returned a negative value indicative of an overflow.\n");
            pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
            return Result;
        }
    }
    else if (**Fmt == '*')
    {
        *Width = WIDTH_STAR;
        *Out++ = *(*Fmt)++;
        if (isdigit((unsigned char) **Fmt))
        {
            /* this is an invalid width because we have a * then a number */
            /* printf handles this by just printing the whole string */
            *Width = WIDTH_INVALID;
            while (isdigit((unsigned char) **Fmt))
            {
               *Out++ = *(*Fmt)++;
            }
        }
    }


    /* grab precision specifier */
    if (**Fmt == '.')
    {
        *Out++ = *(*Fmt)++;
        if (isdigit((unsigned char) **Fmt))
        {
            TempStrPtr = TempStr;
            while (isdigit((unsigned char) **Fmt))
            {
                *TempStrPtr++ = **Fmt;
                *Out++ = *(*Fmt)++;
            }
            *TempStrPtr = 0; /* end string */
            *Precision = atoi(TempStr);
            if (*Precision < 0)
            {
                ERROR("atoi returned a negative value indicative of an overflow.\n");
                pthrCurrent->SetLastError(ERROR_INTERNAL_ERROR);
                return Result;
            }
        }
        else if (**Fmt == '*')
        {
            *Precision = PRECISION_STAR;
            *Out++ = *(*Fmt)++;
            if (isdigit((unsigned char) **Fmt))
            {
                /* this is an invalid precision because we have a .* then a number */
                /* printf handles this by just printing the whole string */
                *Precision = PRECISION_INVALID;
                while (isdigit((unsigned char) **Fmt))
                {
                    *Out++ = *(*Fmt)++;
                }
            }
        }
        else
        {
            *Precision = PRECISION_DOT;
        }
    }

#ifdef BIT64
    if (**Fmt == 'p')
    {
        *Prefix = PFF_PREFIX_LONGLONG;
    }
#endif
    if ((*Fmt)[0] == 'I')
    {
        /* grab prefix of 'I64' for __int64 */
        if ((*Fmt)[1] == '6' && (*Fmt)[2] == '4')
        {
            /* convert to 'll' so that Unix snprintf can handle it */
            *Fmt += 3;
            *Prefix = PFF_PREFIX_LONGLONG;
        }
        /* grab prefix of 'I32' for __int32 */
        else if ((*Fmt)[1] == '3' && (*Fmt)[2] == '2')
        {
            *Fmt += 3;
        }
        else
        {
            ++(*Fmt);
    #ifdef BIT64
            /* convert to 'll' so that Unix snprintf can handle it */
            *Prefix = PFF_PREFIX_LONGLONG;
    #endif
        }
    }
    /* grab a prefix of 'h' */
    else if (**Fmt == 'h')
    {
        *Prefix = PFF_PREFIX_SHORT;
        ++(*Fmt);
    }
    /* grab prefix of 'l' or the undocumented 'w' (at least in MSDN) */
    else if (**Fmt == 'l' || **Fmt == 'w')
    {
        ++(*Fmt);
#ifdef BIT64
        // Only want to change the prefix on 64 bit when printing characters.
        if (**Fmt == 'c' || **Fmt == 's')
#endif
        {
            *Prefix = PFF_PREFIX_LONG;
        }
        if (**Fmt == 'l')
        {
            *Prefix = PFF_PREFIX_LONGLONG;
            ++(*Fmt);
        }
    }
    else if (**Fmt == 'L')
    {
        /* a prefix of 'L' seems to be ignored */
        ++(*Fmt);
    }

    /* grab type 'c' */
    if (**Fmt == 'c' || **Fmt == 'C')
    {
        *Type = PFF_TYPE_CHAR;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'C')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        *Out++ = 'c';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab type 's' */
    else if (**Fmt == 's' || **Fmt == 'S')
    {
        *Type = PFF_TYPE_STRING;
        if (*Prefix != PFF_PREFIX_SHORT && **Fmt == 'S')
        {
            *Prefix = PFF_PREFIX_LONG; /* give it a wide prefix */
        }
        if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        *Out++ = 's';
        ++(*Fmt);
        Result = TRUE;
    }
    /* grab int types */
    else if (**Fmt == 'd' || **Fmt == 'i' || **Fmt == 'o' ||
             **Fmt == 'u' || **Fmt == 'x' || **Fmt == 'X')
    {
        *Type = PFF_TYPE_INT;
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        else if (*Prefix == PFF_PREFIX_LONG)
        {
            *Out++ = 'l';
        }
        else if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            *Out++ = 'l';
            *Out++ = 'l';
        }
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'e' || **Fmt == 'E' || **Fmt == 'f' ||
             **Fmt == 'g' || **Fmt == 'G')
    {
        /* we can safely ignore the prefixes and only add the type*/
        *Type = PFF_TYPE_FLOAT;
        *Out++ = *(*Fmt)++;
        Result = TRUE;
    }
    else if (**Fmt == 'n')
    {
        if (*Prefix == PFF_PREFIX_SHORT)
        {
            *Out++ = 'h';
        }
        *Out++ = *(*Fmt)++;
        *Type = PFF_TYPE_N;
        Result = TRUE;
    }
    else if (**Fmt == 'p')
    {
        *Type = PFF_TYPE_P;
        (*Fmt)++;

        if (*Prefix == PFF_PREFIX_LONGLONG)
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 16;
                *Out++ = '.';
                *Out++ = '1';
                *Out++ = '6';
            }
            /* native *printf does not support %I64p
               (actually %llp), so we need to cheat a little bit */
            *Out++ = 'l';
            *Out++ = 'l';
        }
        else
        {
            if (*Precision == PRECISION_DEFAULT)
            {
                *Precision = 8;
                *Out++ = '.';
                *Out++ = '8';
            }
        }
        *Out++ = 'X';
        Result = TRUE;
    }

    *Out = 0;  /* end the string */
    InternalFree(TempStr);
    return Result;
}